

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::ComputeNormals
          (LWOImporter *this,aiMesh *mesh,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *smoothingGroups,Surface *surface)

{
  uint uVar1;
  uint uVar2;
  aiVector3D *paVar3;
  pointer puVar4;
  uint i;
  aiVector3D *paVar5;
  aiVector3t<float> *paVar6;
  ulong uVar7;
  pointer puVar8;
  aiFace *paVar9;
  uint *puVar10;
  uint i_1;
  ulong uVar11;
  uint *puVar12;
  float fVar13;
  float fVar14;
  reference rVar15;
  aiVector3t<float> aVar16;
  uint32_t *local_f0;
  aiVector3t<float> local_e0;
  allocator_type local_cd;
  ai_real local_cc;
  aiFace *local_c8;
  LWOImporter *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> poResult;
  vector<bool,_std::allocator<bool>_> vertexDone;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> faceNormals;
  SGSpatialSort sSort;
  
  uVar7 = (ulong)mesh->mNumVertices;
  local_c0 = this;
  paVar5 = (aiVector3D *)operator_new__(uVar7 * 0xc);
  if (uVar7 != 0) {
    uVar11 = uVar7 * 0xc - 0xc;
    memset(paVar5,0,(uVar11 - uVar11 % 0xc) + 0xc);
  }
  mesh->mNormals = paVar5;
  faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((surface->mMaximumSmoothAngle != 0.0) || (NAN(surface->mMaximumSmoothAngle))) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&faceNormals,uVar7);
    paVar5 = faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  paVar9 = mesh->mFaces;
  local_c8 = paVar9 + mesh->mNumFaces;
  for (; paVar9 != local_c8; paVar9 = paVar9 + 1) {
    if (2 < paVar9->mNumIndices) {
      paVar3 = mesh->mVertices;
      puVar10 = paVar9->mIndices;
      uVar1 = *puVar10;
      uVar2 = puVar10[paVar9->mNumIndices - 1];
      aVar16 = operator-(paVar3 + puVar10[1],paVar3 + uVar1);
      poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = aVar16._0_8_;
      poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(poResult.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish._4_4_,aVar16.z);
      aVar16 = operator-(paVar3 + uVar2,paVar3 + uVar1);
      local_e0.z = aVar16.z;
      local_e0._0_8_ = aVar16._0_8_;
      aVar16 = operator^((aiVector3t<float> *)&poResult,&local_e0);
      vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = (uint)aVar16.z;
      vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = aVar16._0_8_;
      paVar6 = aiVector3t<float>::Normalize((aiVector3t<float> *)&vertexDone);
      sSort.mPlaneNormal.z = paVar6->z;
      sSort.mPlaneNormal.x = paVar6->x;
      sSort.mPlaneNormal.y = paVar6->y;
      for (uVar7 = 0; uVar7 < paVar9->mNumIndices; uVar7 = uVar7 + 1) {
        uVar1 = paVar9->mIndices[uVar7];
        paVar5[uVar1].z = sSort.mPlaneNormal.z;
        paVar5[uVar1].x = sSort.mPlaneNormal.x;
        paVar5[uVar1].y = sSort.mPlaneNormal.y;
      }
    }
  }
  if ((surface->mMaximumSmoothAngle != 0.0) || (NAN(surface->mMaximumSmoothAngle))) {
    local_cc = ComputePositionEpsilon(mesh);
    SGSpatialSort::SGSpatialSort(&sSort);
    puVar10 = (smoothingGroups->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (paVar9 = mesh->mFaces; paVar9 != local_c8; paVar9 = paVar9 + 1) {
      for (uVar7 = 0; uVar7 < paVar9->mNumIndices; uVar7 = uVar7 + 1) {
        SGSpatialSort::Add(&sSort,mesh->mVertices + paVar9->mIndices[uVar7],paVar9->mIndices[uVar7],
                           *puVar10);
      }
      puVar10 = puVar10 + 1;
    }
    SGSpatialSort::Prepare(&sSort);
    poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&poResult,0x14);
    if ((3.0 <= surface->mMaximumSmoothAngle) || (local_c0->configSpeedFlag != false)) {
      local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&vertexDone,(ulong)mesh->mNumVertices,(bool *)&local_e0,&local_cd);
      local_f0 = (smoothingGroups->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      for (paVar9 = mesh->mFaces; paVar9 != local_c8; paVar9 = paVar9 + 1) {
        puVar10 = paVar9->mIndices;
        puVar12 = puVar10 + paVar9->mNumIndices;
        for (; puVar10 != puVar12; puVar10 = puVar10 + 1) {
          uVar1 = *puVar10;
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&vertexDone,(ulong)uVar1);
          if ((*rVar15._M_p & rVar15._M_mask) == 0) {
            SGSpatialSort::FindPositions
                      (&sSort,mesh->mVertices + uVar1,*local_f0,local_cc,&poResult,true);
            puVar4 = poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_e0.x = 0.0;
            local_e0.y = 0.0;
            local_e0.z = 0.0;
            fVar13 = 0.0;
            fVar14 = 0.0;
            for (puVar8 = poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                puVar8 != poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
              uVar1 = *puVar8;
              fVar14 = fVar14 + faceNormals.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar1].x;
              fVar13 = fVar13 + faceNormals.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar1].y;
              local_e0.y = fVar13;
              local_e0.x = fVar14;
              local_e0.z = local_e0.z +
                           faceNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1].z;
            }
            aiVector3t<float>::Normalize(&local_e0);
            for (puVar8 = poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4;
                puVar8 = puVar8 + 1) {
              paVar5 = mesh->mNormals;
              uVar1 = *puVar8;
              paVar5[uVar1].z = local_e0.z;
              paVar5 = paVar5 + uVar1;
              paVar5->x = local_e0.x;
              paVar5->y = local_e0.y;
              rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&vertexDone,(ulong)*puVar8);
              *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
            }
          }
        }
        local_f0 = local_f0 + 1;
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&vertexDone.super__Bvector_base<std::allocator<bool>_>);
    }
    else {
      fVar13 = cosf(surface->mMaximumSmoothAngle);
      local_c0 = (LWOImporter *)
                 (smoothingGroups->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      for (paVar9 = mesh->mFaces; paVar9 != local_c8; paVar9 = paVar9 + 1) {
        puVar12 = paVar9->mIndices;
        puVar10 = puVar12 + paVar9->mNumIndices;
        for (; puVar12 != puVar10; puVar12 = puVar12 + 1) {
          uVar1 = *puVar12;
          SGSpatialSort::FindPositions
                    (&sSort,mesh->mVertices + uVar1,
                     *(uint32_t *)&(local_c0->super_BaseImporter)._vptr_BaseImporter,local_cc,
                     &poResult,true);
          puVar4 = poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          for (puVar8 = poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4;
              puVar8 = puVar8 + 1) {
            paVar6 = faceNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + *puVar8;
            fVar14 = ::operator*(paVar6,faceNormals.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar1);
            if (fVar13 <= fVar14) {
              vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)
                   CONCAT44(paVar6->y +
                            vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            paVar6->x +
                            vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_);
              vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_offset =
                   (uint)(paVar6->z +
                         (float)vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset
                         );
            }
          }
          paVar6 = aiVector3t<float>::Normalize((aiVector3t<float> *)&vertexDone);
          paVar5 = mesh->mNormals;
          paVar5[uVar1].z = paVar6->z;
          fVar14 = paVar6->y;
          paVar5 = paVar5 + uVar1;
          paVar5->x = paVar6->x;
          paVar5->y = fVar14;
        }
        local_c0 = (LWOImporter *)((long)&(local_c0->super_BaseImporter)._vptr_BaseImporter + 4);
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    SGSpatialSort::~SGSpatialSort(&sSort);
  }
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
            );
  return;
}

Assistant:

void LWOImporter::ComputeNormals(aiMesh* mesh, const std::vector<unsigned int>& smoothingGroups,
    const LWO::Surface& surface)
{
    // Allocate output storage
    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // First generate per-face normals
    aiVector3D* out;
    std::vector<aiVector3D> faceNormals;

    // ... in some cases that's already enough
    if (!surface.mMaximumSmoothAngle)
        out = mesh->mNormals;
    else    {
        faceNormals.resize(mesh->mNumVertices);
        out = &faceNormals[0];
    }

    aiFace* begin = mesh->mFaces, *const end = mesh->mFaces+mesh->mNumFaces;
    for (; begin != end; ++begin)   {
        aiFace& face = *begin;

        if(face.mNumIndices < 3) {
            continue;
        }

        // LWO doc: "the normal is defined as the cross product of the first and last edges"
        aiVector3D* pV1 = mesh->mVertices + face.mIndices[0];
        aiVector3D* pV2 = mesh->mVertices + face.mIndices[1];
        aiVector3D* pV3 = mesh->mVertices + face.mIndices[face.mNumIndices-1];

        aiVector3D vNor = ((*pV2 - *pV1) ^(*pV3 - *pV1)).Normalize();
        for (unsigned int i = 0; i < face.mNumIndices;++i)
            out[face.mIndices[i]] = vNor;
    }
    if (!surface.mMaximumSmoothAngle)return;
    const float posEpsilon = ComputePositionEpsilon(mesh);

    // Now generate the spatial sort tree
    SGSpatialSort sSort;
    std::vector<unsigned int>::const_iterator it = smoothingGroups.begin();
    for( begin =  mesh->mFaces; begin != end; ++begin, ++it)
    {
        aiFace& face = *begin;
        for (unsigned int i = 0; i < face.mNumIndices;++i)
        {
            unsigned int tt = face.mIndices[i];
            sSort.Add(mesh->mVertices[tt],tt,*it);
        }
    }
    // Sort everything - this takes O(nlogn) time
    sSort.Prepare();
    std::vector<unsigned int> poResult;
    poResult.reserve(20);

    // Generate vertex normals. We have O(logn) for the binary lookup, which we need
    // for n elements, thus the EXPECTED complexity is O(nlogn)
    if (surface.mMaximumSmoothAngle < 3.f && !configSpeedFlag)  {
        const float fLimit = std::cos(surface.mMaximumSmoothAngle);

        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    if (v * faceNormals[idx] < fLimit)
                        continue;
                    vNormals += v;
                }
                mesh->mNormals[idx] = vNormals.Normalize();
            }
        }
    }
     // faster code path in case there is no smooth angle
    else    {
        std::vector<bool> vertexDone(mesh->mNumVertices,false);
        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                if (vertexDone[idx])
                    continue;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    vNormals += v;
                }
                vNormals.Normalize();
                for (a =  poResult.begin();a != end;++a)    {
                    mesh->mNormals[*a] = vNormals;
                    vertexDone[*a] = true;
                }
            }
        }
    }
}